

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int encodeLatLonToMapcodes_internal
              (Mapcodes *mapcodes,double lat,double lon,Territory territoryContext,
              int stop_with_one_result,int requiredEncoder,int extraDigits)

{
  uint uVar1;
  MapcodeError MVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Territory ccode;
  Territory in_R9D;
  EncodeRec enc;
  
  mapcodes->count = 0;
  enc.mapcodes = mapcodes;
  MVar2 = convertCoordsToMicrosAndFractions(&enc.coord32,&enc.fraclat,&enc.fraclon,lat,lon);
  if (MVar2 < ERR_OK) {
    iVar4 = 0;
  }
  else {
    if (territoryContext < _TERRITORY_MIN) {
      iVar3 = enc.coord32.latMicroDeg + enc.coord32.lonMicroDeg;
      iVar4 = 0;
      while( true ) {
        uVar1 = REDIVAR[iVar4];
        if ((ulong)uVar1 < 0x400) break;
        enc.coord32.lonMicroDeg = iVar3 - enc.coord32.lonMicroDeg;
        if ((int)uVar1 < enc.coord32.lonMicroDeg) {
          iVar4 = REDIVAR[iVar4 + 1];
        }
        else {
          iVar4 = iVar4 + 2;
        }
      }
      for (uVar5 = 0; uVar1 + 1 != uVar5; uVar5 = uVar5 + 1) {
        ccode = TERRITORY_AAA;
        if (uVar1 != uVar5) {
          ccode = REDIVAR[uVar5 + (long)(iVar4 + 1)];
        }
        encoderEngine(ccode,&enc,stop_with_one_result,requiredEncoder,-1,in_R9D);
        if ((stop_with_one_result != 0) && (0 < (enc.mapcodes)->count)) break;
      }
    }
    else {
      encoderEngine(territoryContext,&enc,stop_with_one_result,requiredEncoder,-1,in_R9D);
    }
    iVar4 = mapcodes->count;
  }
  return iVar4;
}

Assistant:

static int encodeLatLonToMapcodes_internal(Mapcodes *mapcodes,
                                           const double lat, const double lon,
                                           const enum Territory territoryContext, const int stop_with_one_result,
                                           const int requiredEncoder, const int extraDigits) {
    EncodeRec enc;
    enc.mapcodes = mapcodes;
    enc.mapcodes->count = 0;
    ASSERT(mapcodes);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (convertCoordsToMicrosAndFractions(&enc.coord32, &enc.fraclat, &enc.fraclon, lat, lon) < 0) {
        return 0;
    }

    if (territoryContext < _TERRITORY_MIN) // ALL results?
    {

#ifndef NO_FAST_ENCODE
        {
            const int sum = enc.coord32.lonMicroDeg + enc.coord32.latMicroDeg;
            int coord = enc.coord32.lonMicroDeg;
            int i = 0; // pointer into REDIVAR
            for (;;) {
                const int r = REDIVAR[i++];
                if (r >= 0 && r < 1024) { // leaf?
                    int j;
                    for (j = 0; j <= r; j++) {
                        const enum Territory ccode = (j == r ? TERRITORY_AAA : (enum Territory) REDIVAR[i + j]);
                        encoderEngine(ccode, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                        if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                            break;
                        }
                    }
                    break;
                } else {
                    coord = sum - coord;
                    if (coord > r) {
                        i = REDIVAR[i];
                    } else {
                        i++;
                    }
                }
            }
        }
#else
        {
            int i;
            for (i = _TERRITORY_MIN + 1; i < _TERRITORY_MAX; i++) {
                encoderEngine((enum Territory) i, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                    break;
                }
            }
        }
#endif

    } else {
        encoderEngine(territoryContext, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
    }
    return mapcodes->count;
}